

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_node_copy_data(mpack_node_t node,char *buffer,size_t bufsize)

{
  mpack_tree_error_t p_Var1;
  mpack_error_t mVar2;
  mpack_tree_t *pmVar3;
  mpack_node_data_t *pmVar4;
  
  pmVar3 = node.tree;
  pmVar4 = node.data;
  if (pmVar3->error != mpack_ok) {
    return 0;
  }
  if (pmVar4->type - mpack_type_array < 0xfffffffd) {
    pmVar3->error = mpack_error_type;
    p_Var1 = pmVar3->error_fn;
    if (p_Var1 == (mpack_tree_error_t)0x0) {
      return 0;
    }
    mVar2 = mpack_error_type;
  }
  else {
    if (pmVar4->len <= bufsize) {
      memcpy(buffer,pmVar3->data + (long)(pmVar4->value).children,(ulong)pmVar4->len);
      return (ulong)pmVar4->len;
    }
    pmVar3->error = mpack_error_too_big;
    p_Var1 = pmVar3->error_fn;
    if (p_Var1 == (mpack_tree_error_t)0x0) {
      return 0;
    }
    mVar2 = mpack_error_too_big;
  }
  (*p_Var1)(pmVar3,mVar2);
  return 0;
}

Assistant:

size_t mpack_node_copy_data(mpack_node_t node, char* buffer, size_t bufsize) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_assert(bufsize == 0 || buffer != NULL, "buffer is NULL for maximum of %i bytes", (int)bufsize);

    mpack_type_t type = node.data->type;
    if (type != mpack_type_str && type != mpack_type_bin && type != mpack_type_ext) {
        mpack_node_flag_error(node, mpack_error_type);
        return 0;
    }

    if (node.data->len > bufsize) {
        mpack_node_flag_error(node, mpack_error_too_big);
        return 0;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    return (size_t)node.data->len;
}